

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_writer.cpp
# Opt level: O2

void __thiscall
duckdb::StructColumnWriter::Analyze
          (StructColumnWriter *this,ColumnWriterState *state_p,ColumnWriterState *parent,
          Vector *vector,idx_t count)

{
  int iVar1;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  reference pvVar2;
  pointer pCVar3;
  reference this_01;
  type pCVar4;
  reference this_02;
  type pVVar5;
  idx_t child_idx;
  ulong __n;
  
  this_00 = StructVector::GetEntries(vector);
  for (__n = 0; __n < (ulong)((long)(this->child_writers).
                                    super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->child_writers).
                                    super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    pvVar2 = vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_true>
             ::get<true>(&this->child_writers,__n);
    pCVar3 = unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>::
             operator->(pvVar2);
    iVar1 = (*pCVar3->_vptr_ColumnWriter[3])(pCVar3);
    if ((char)iVar1 != '\0') {
      pvVar2 = vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_true>
               ::get<true>(&this->child_writers,__n);
      pCVar3 = unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>::
               operator->(pvVar2);
      this_01 = vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                ::get<true>((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                             *)&state_p[1].definition_levels.
                                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_finish,__n);
      pCVar4 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
               ::operator*(this_01);
      this_02 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                ::get<true>(this_00,__n);
      pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (this_02);
      (*pCVar3->_vptr_ColumnWriter[4])(pCVar3,pCVar4,state_p,pVVar5,count);
    }
  }
  return;
}

Assistant:

void StructColumnWriter::Analyze(ColumnWriterState &state_p, ColumnWriterState *parent, Vector &vector, idx_t count) {
	auto &state = state_p.Cast<StructColumnWriterState>();
	auto &child_vectors = StructVector::GetEntries(vector);
	for (idx_t child_idx = 0; child_idx < child_writers.size(); child_idx++) {
		// Need to check again. It might be that just one child needs it but the rest not
		if (child_writers[child_idx]->HasAnalyze()) {
			child_writers[child_idx]->Analyze(*state.child_states[child_idx], &state_p, *child_vectors[child_idx],
			                                  count);
		}
	}
}